

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

void __thiscall QMessageBox::keyPressEvent(QMessageBox *this,QKeyEvent *e)

{
  uint uVar1;
  QMessageBoxDetailsText *pQVar2;
  QAbstractButton *this_00;
  QAbstractButton **ppQVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  EVP_PKEY_CTX *src;
  long lVar8;
  EVP_PKEY_CTX *dst;
  StandardKey SVar9;
  long lVar10;
  long in_FS_OFFSET;
  QKeySequence shortcut;
  QArrayDataPointer<QAbstractButton_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar8 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  SVar9 = (StandardKey)e;
  cVar4 = QKeyEvent::matches(SVar9);
  if (cVar4 == '\0') {
    dst = (EVP_PKEY_CTX *)0x9;
    cVar4 = QKeyEvent::matches(SVar9);
    if (cVar4 == '\0') {
      cVar4 = QKeyEvent::matches(SVar9);
      if (((cVar4 != '\0') &&
          (pQVar2 = *(QMessageBoxDetailsText **)(lVar8 + 0x340),
          pQVar2 != (QMessageBoxDetailsText *)0x0)) &&
         ((((pQVar2->super_QWidget).data)->widget_attributes & 0x8000) != 0)) {
        QMessageBoxDetailsText::selectAll(pQVar2);
        goto LAB_004ba949;
      }
    }
    else {
      pQVar2 = *(QMessageBoxDetailsText **)(lVar8 + 0x340);
      if (((pQVar2 != (QMessageBoxDetailsText *)0x0) &&
          ((((pQVar2->super_QWidget).data)->widget_attributes & 0x8000) != 0)) &&
         (iVar5 = QMessageBoxDetailsText::copy(pQVar2,dst,src), (char)iVar5 != '\0')) {
LAB_004ba949:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          (**(code **)(*(long *)e + 0x10))(e,1);
          return;
        }
        goto LAB_004ba994;
      }
    }
    uVar7 = QKeyEvent::modifiers();
    if (((uVar7 & 0x1c000000) == 0) && (uVar1 = *(uint *)(e + 0x40), (uVar1 & 0x1ffffff) != 0)) {
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (QAbstractButton **)&DAT_aaaaaaaaaaaaaaaa;
      QDialogButtonBox::buttons
                ((QList<QAbstractButton_*> *)&local_58,*(QDialogButtonBox **)(lVar8 + 0x2f8));
      ppQVar3 = local_58.ptr;
      lVar10 = local_58.size << 3;
      for (lVar8 = 0; lVar10 != lVar8; lVar8 = lVar8 + 8) {
        this_00 = *(QAbstractButton **)((long)ppQVar3 + lVar8);
        _shortcut = &DAT_aaaaaaaaaaaaaaaa;
        QAbstractButton::shortcut((QAbstractButton *)&shortcut);
        cVar4 = QKeySequence::isEmpty();
        if ((cVar4 == '\0') &&
           (uVar6 = QKeySequence::operator[]((uint)&shortcut),
           (uVar1 & 0x1ffffff) == (uVar6 & 0x1ffffff))) {
          QAbstractButton::animateClick(this_00);
          QKeySequence::~QKeySequence(&shortcut);
          QArrayDataPointer<QAbstractButton_*>::~QArrayDataPointer(&local_58);
          goto LAB_004ba925;
        }
        QKeySequence::~QKeySequence(&shortcut);
      }
      QArrayDataPointer<QAbstractButton_*>::~QArrayDataPointer(&local_58);
    }
    QDialog::keyPressEvent(&this->super_QDialog,e);
  }
  else if (*(QAbstractButton **)(lVar8 + 0x350) != (QAbstractButton *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QAbstractButton::click(*(QAbstractButton **)(lVar8 + 0x350));
      return;
    }
    goto LAB_004ba994;
  }
LAB_004ba925:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_004ba994:
  __stack_chk_fail();
}

Assistant:

void QMessageBox::keyPressEvent(QKeyEvent *e)
{
#if QT_CONFIG(shortcut)
        Q_D(QMessageBox);
        if (e->matches(QKeySequence::Cancel)) {
            if (d->detectedEscapeButton) {
#ifdef Q_OS_MAC
                d->detectedEscapeButton->animateClick();
#else
                d->detectedEscapeButton->click();
#endif
            }
            return;
        }
#endif // QT_CONFIG(shortcut)

#if !defined(QT_NO_CLIPBOARD) && !defined(QT_NO_SHORTCUT)

#if QT_CONFIG(textedit)
        if (e == QKeySequence::Copy) {
            if (d->detailsText && d->detailsText->isVisible() && d->detailsText->copy()) {
                e->setAccepted(true);
                return;
            }
        } else if (e == QKeySequence::SelectAll && d->detailsText && d->detailsText->isVisible()) {
            d->detailsText->selectAll();
            e->setAccepted(true);
            return;
        }
#endif // QT_CONFIG(textedit)

#if defined(Q_OS_WIN)
        if (e == QKeySequence::Copy) {
            const auto separator = "---------------------------\n"_L1;
            QString textToCopy;
            textToCopy += separator + windowTitle() + u'\n' + separator // title
                          + d->label->text() + u'\n' + separator;       // text

            if (d->informativeLabel)
                textToCopy += d->informativeLabel->text() + u'\n' + separator;

            const QList<QAbstractButton *> buttons = d->buttonBox->buttons();
            for (const auto *button : buttons)
                textToCopy += button->text() + "   "_L1;
            textToCopy += u'\n' + separator;
#if QT_CONFIG(textedit)
            if (d->detailsText)
                textToCopy += d->detailsText->text() + u'\n' + separator;
#endif
            QGuiApplication::clipboard()->setText(textToCopy);
            return;
        }
#endif // Q_OS_WIN

#endif // !QT_NO_CLIPBOARD && !QT_NO_SHORTCUT

#ifndef QT_NO_SHORTCUT
    if (!(e->modifiers() & (Qt::AltModifier | Qt::ControlModifier | Qt::MetaModifier))) {
        int key = e->key() & ~Qt::MODIFIER_MASK;
        if (key) {
            const QList<QAbstractButton *> buttons = d->buttonBox->buttons();
            for (auto *pb : buttons) {
                QKeySequence shortcut = pb->shortcut();
                if (!shortcut.isEmpty() && key == shortcut[0].key()) {
                    pb->animateClick();
                    return;
                }
            }
        }
    }
#endif
    QDialog::keyPressEvent(e);
}